

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int ON_Font::CompareFontCharacteristics(ON_Font *lhs,ON_Font *rhs)

{
  int iVar1;
  bool bIgnoreUnsetCharacteristics;
  bool bComparePlatformSpecificCharacteristics;
  ON_Font *rhs_local;
  ON_Font *lhs_local;
  
  iVar1 = CompareFontCharacteristicsForExperts(true,false,lhs,rhs);
  return iVar1;
}

Assistant:

int ON_Font::CompareFontCharacteristics(
  const ON_Font& lhs,
  const ON_Font& rhs
)
{
  const bool bComparePlatformSpecificCharacteristics = true;
  const bool bIgnoreUnsetCharacteristics = false;
  return ON_Font::CompareFontCharacteristicsForExperts(
    bComparePlatformSpecificCharacteristics,
    bIgnoreUnsetCharacteristics,
    lhs,
    rhs
  );
}